

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_fixed_suite::fixed_front_const(void)

{
  array<int,_4UL> array;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_18 = 0xb;
  uStack_14 = 0x16;
  uStack_10 = 0x21;
  uStack_c = 0x2c;
  local_1c = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x368,"void api_fixed_suite::fixed_front_const()",&local_18,&local_1c);
  return;
}

Assistant:

void fixed_front_const()
{
    std::array<int, 4> array = {11, 22, 33, 44};
    const circular_view<int, 4> span(array.begin(), array.end(), array.begin(), array.size());
    BOOST_TEST_EQ(span.front(), 11);
}